

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O1

void __thiscall cfd::core::Txid::Txid(Txid *this,ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  this->_vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  ByteData256::GetBytes(&local_28,data);
  ByteData::ByteData(&this->data_,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Txid::Txid(const ByteData256& data) : data_(ByteData(data.GetBytes())) {
  // do nothing
}